

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::updateShortcut(QLabelPrivate *this)

{
  bool bVar1;
  int iVar2;
  QKeySequence *key;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  CaseSensitivity in_stack_ffffffffffffffbc;
  QString *in_stack_ffffffffffffffc0;
  QKeySequence local_18 [14];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = (QKeySequence *)q_func(in_RDI);
  *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xffdf;
  QChar::QChar<char16_t,_true>(&local_a,L'&');
  bVar1 = QString::contains(in_stack_ffffffffffffffc0,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                            in_stack_ffffffffffffffbc);
  if (bVar1) {
    *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xffdf | 0x20;
    QKeySequence::mnemonic((QString *)local_18);
    iVar2 = QWidget::grabShortcut((QWidget *)in_RDI,key,in_stack_ffffffffffffffbc);
    in_RDI->shortcutId = iVar2;
    QKeySequence::~QKeySequence(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::updateShortcut()
{
    Q_Q(QLabel);
    Q_ASSERT(shortcutId == 0);
    // Introduce an extra boolean to indicate the presence of a shortcut in the
    // text. We cannot use the shortcutId itself because on the mac mnemonics are
    // off by default, so QKeySequence::mnemonic always returns an empty sequence.
    // But then we do want to hide the ampersands, so we can't use shortcutId.
    hasShortcut = false;

    if (!text.contains(u'&'))
        return;
    hasShortcut = true;
    shortcutId = q->grabShortcut(QKeySequence::mnemonic(text));
}